

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O2

void __thiscall Promise::Tick(Promise *this)

{
  shared_ptr<Promise> sStack_28;
  
  if (this->handler_ran == false) {
    this->handler_ran = true;
    if ((this->manually_resolved_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
      if ((this->auto_resolved_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_()>::operator()(&this->auto_resolved_handler);
      }
      Resolve(this);
      return;
    }
    std::__shared_ptr<Promise,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Promise,void>
              ((__shared_ptr<Promise,(__gnu_cxx::_Lock_policy)2> *)&sStack_28,
               (__weak_ptr<Promise,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<Promise>);
    std::function<void_(std::shared_ptr<Promise>)>::operator()
              (&this->manually_resolved_handler,&sStack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_28.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

virtual void Tick() {
    if (!handler_ran) {
      // Setting it before call to have ability to override it in handler
      handler_ran = true;

      if (manually_resolved_handler) {
        manually_resolved_handler(shared_from_this());
      } else if (auto_resolved_handler) {
        auto_resolved_handler();
        Resolve();
      } else {
        Resolve();
      }
    }
  }